

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O2

bool __thiscall
cmExportLibraryDependenciesCommand::InitialPass
          (cmExportLibraryDependenciesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  allocator local_39;
  string local_38;
  
  bVar2 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0033,
                     "The export_library_dependencies command should not be called; see CMP0033.");
  bVar3 = true;
  if (!bVar2) {
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::string
                ((string *)&local_38,"called with incorrect number of arguments",&local_39);
      cmCommand::SetError(&this->super_cmCommand,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      bVar3 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->Filename);
      this->Append = false;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x20 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
        bVar2 = std::operator==(pbVar1 + 1,"APPEND");
        if (bVar2) {
          this->Append = true;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmExportLibraryDependenciesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0033,
      "The export_library_dependencies command should not be called; "
      "see CMP0033."))
    { return true; }
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // store the arguments for the final pass
  this->Filename = args[0];
  this->Append = false;
  if(args.size() > 1)
    {
    if(args[1] == "APPEND")
      {
      this->Append = true;
      }
    }
  return true;
}